

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlXPathObjectPtr xmlXPathCacheNewBoolean(xmlXPathContextPtr ctxt,int val)

{
  int iVar1;
  void *pvVar2;
  long *plVar3;
  xmlXPathObjectPtr pxVar4;
  
  if ((ctxt != (xmlXPathContextPtr)0x0) && (pvVar2 = ctxt->cache, pvVar2 != (void *)0x0)) {
    plVar3 = *(long **)((long)pvVar2 + 0x10);
    if (plVar3 != (long *)0x0) {
      iVar1 = (int)plVar3[1];
      if ((long)iVar1 != 0) {
        *(int *)(plVar3 + 1) = iVar1 + -1;
        pxVar4 = *(xmlXPathObjectPtr *)(*plVar3 + -8 + (long)iVar1 * 8);
        goto LAB_001e225f;
      }
    }
    plVar3 = *(long **)((long)pvVar2 + 0x20);
    if (plVar3 != (long *)0x0) {
      iVar1 = (int)plVar3[1];
      if ((long)iVar1 != 0) {
        *(int *)(plVar3 + 1) = iVar1 + -1;
        pxVar4 = *(xmlXPathObjectPtr *)(*plVar3 + -8 + (long)iVar1 * 8);
LAB_001e225f:
        pxVar4->type = XPATH_BOOLEAN;
        pxVar4->boolval = (uint)(val != 0);
        return pxVar4;
      }
    }
  }
  pxVar4 = xmlXPathNewBoolean(val);
  return pxVar4;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheNewBoolean(xmlXPathContextPtr ctxt, int val)
{
    if ((ctxt != NULL) && (ctxt->cache)) {
	xmlXPathContextCachePtr cache = (xmlXPathContextCachePtr) ctxt->cache;

	if ((cache->booleanObjs != NULL) &&
	    (cache->booleanObjs->number != 0))
	{
	    xmlXPathObjectPtr ret;

	    ret = (xmlXPathObjectPtr)
		cache->booleanObjs->items[--cache->booleanObjs->number];
	    ret->type = XPATH_BOOLEAN;
	    ret->boolval = (val != 0);
#ifdef XP_DEBUG_OBJ_USAGE
	    xmlXPathDebugObjUsageRequested(ctxt, XPATH_BOOLEAN);
#endif
	    return(ret);
	} else if ((cache->miscObjs != NULL) &&
	    (cache->miscObjs->number != 0))
	{
	    xmlXPathObjectPtr ret;

	    ret = (xmlXPathObjectPtr)
		cache->miscObjs->items[--cache->miscObjs->number];

	    ret->type = XPATH_BOOLEAN;
	    ret->boolval = (val != 0);
#ifdef XP_DEBUG_OBJ_USAGE
	    xmlXPathDebugObjUsageRequested(ctxt, XPATH_BOOLEAN);
#endif
	    return(ret);
	}
    }
    return(xmlXPathNewBoolean(val));
}